

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::BinaryOp_x86_avx_functor::binary_op_rdiv>
              (Mat *a,float b,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar4 [32];
  undefined8 uVar8;
  __m128 afVar9;
  __m128 _p_1;
  __m128 _b;
  __m256 _p;
  __m256 _b_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_rdiv op;
  Mat *m;
  __m256 *in_stack_fffffffffffffd00;
  __m256 *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  float local_2c0 [2];
  float afStack_2b8 [2];
  float local_2b0 [4];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  int local_244;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined4 local_228;
  long local_220;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined8 local_200;
  float *local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  binary_op_rdiv local_1d1 [13];
  float local_1c4;
  long *local_1c0;
  undefined8 *local_1b8;
  undefined1 local_1ad;
  int local_1ac;
  undefined8 *local_1a0;
  undefined8 *local_190;
  float *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float *local_150;
  float *local_148;
  float local_140 [2];
  float afStack_138 [4];
  float *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  float *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined8 *local_c0;
  float local_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_1d8 = *(int *)((long)in_RDI + 0x2c);
  local_1dc = (int)in_RDI[6];
  local_1e0 = *(int *)((long)in_RDI + 0x34);
  local_1e4 = (int)in_RDI[7];
  local_1e8 = (int)in_RDI[3];
  local_1ec = local_1d8 * local_1dc * local_1e0 * local_1e8;
  local_1c4 = in_XMM0_Da;
  local_1c0 = in_RDI;
  for (local_1f0 = 0; local_1f0 < local_1e4; local_1f0 = local_1f0 + 1) {
    local_1a0 = &local_240;
    local_f4 = *(int *)((long)local_1c0 + 0x2c);
    local_f8 = (int)local_1c0[6];
    local_fc = *(undefined4 *)((long)local_1c0 + 0x34);
    local_1f8 = (float *)(*local_1c0 + local_1c0[8] * (long)local_1f0 * local_1c0[2]);
    local_110 = local_1c0[2];
    local_114 = (undefined4)local_1c0[3];
    local_120 = local_1c0[4];
    local_f0 = &local_240;
    local_e0 = (long)local_f4 * (long)local_f8 * local_110;
    local_190 = &local_240;
    local_1b8 = &local_240;
    local_e4 = 0x10;
    local_1ac = local_1f0;
    local_1ad = 1;
    local_240 = 0;
    local_230 = 0;
    local_228 = 0;
    local_218 = 0;
    local_214 = 0;
    local_210 = 0;
    local_20c = 0;
    local_208 = 0;
    local_200 = 0;
    local_238 = 0;
    local_244 = 0;
    local_a4 = local_1c4;
    local_34 = local_1c4;
    local_38 = local_1c4;
    local_3c = local_1c4;
    local_40 = local_1c4;
    local_44 = local_1c4;
    local_48 = local_1c4;
    local_4c = local_1c4;
    local_50 = local_1c4;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_1c4),ZEXT416((uint)local_1c4),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_1c4),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_1c4),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_1c4),ZEXT416((uint)local_1c4),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_1c4),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_1c4),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_80._0_8_ = auVar2._0_8_;
    local_80._8_8_ = auVar2._8_8_;
    local_80._16_8_ = auVar1._0_8_;
    local_80._24_8_ = auVar1._8_8_;
    local_280 = local_80._0_8_;
    uStack_278 = local_80._8_8_;
    uStack_270 = local_80._16_8_;
    uStack_268 = local_80._24_8_;
    fVar3 = local_1c4;
    local_108 = local_1f8;
    local_c0 = local_1b8;
    local_80 = auVar4;
    local_220 = local_120;
    for (; local_244 + 7 < local_1ec; local_244 = local_244 + 8) {
      local_188 = local_1f8;
      uVar6 = *(undefined8 *)local_1f8;
      uVar5 = *(undefined8 *)(local_1f8 + 2);
      uVar7 = *(undefined8 *)(local_1f8 + 4);
      uVar8 = *(undefined8 *)(local_1f8 + 6);
      local_2a0 = uVar6;
      uStack_298 = uVar5;
      uStack_290 = uVar7;
      uStack_288 = uVar8;
      BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack8
                ((binary_op_rdiv *)CONCAT44(fVar3,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      local_150 = local_1f8;
      *(undefined8 *)local_1f8 = uVar6;
      *(undefined8 *)(local_1f8 + 2) = uVar5;
      *(undefined8 *)(local_1f8 + 4) = uVar7;
      *(undefined8 *)(local_1f8 + 6) = uVar8;
      local_1f8 = local_1f8 + 8;
      local_2a0 = uVar6;
      uStack_298 = uVar5;
      uStack_290 = uVar7;
      uStack_288 = uVar8;
      local_180 = uVar6;
      uStack_178 = uVar5;
      uStack_170 = uVar7;
      uStack_168 = uVar8;
    }
    local_84 = local_1c4;
    local_a0 = local_1c4;
    fStack_9c = local_1c4;
    fStack_98 = local_1c4;
    fStack_94 = local_1c4;
    for (; local_244 + 3 < local_1ec; local_244 = local_244 + 4) {
      local_148 = local_1f8;
      local_2c0 = *(float (*) [2])local_1f8;
      uVar6 = *(undefined8 *)(local_1f8 + 2);
      afStack_2b8 = (float  [2])uVar6;
      afVar9 = BinaryOp_x86_avx_functor::binary_op_rdiv::func_pack4
                         (local_1d1,(__m128 *)local_2c0,&local_2b0);
      local_2c0 = afVar9._0_8_;
      local_128 = local_1f8;
      *(float (*) [2])local_1f8 = local_2c0;
      *(undefined8 *)(local_1f8 + 2) = uVar6;
      local_1f8 = local_1f8 + 4;
      afStack_2b8 = (float  [2])uVar6;
      local_140 = local_2c0;
      afStack_138._0_8_ = uVar6;
    }
    for (; local_244 < local_1ec; local_244 = local_244 + 1) {
      fVar3 = BinaryOp_x86_avx_functor::binary_op_rdiv::func(local_1d1,local_1f8,&local_1c4);
      *local_1f8 = fVar3;
      local_1f8 = local_1f8 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps((float)b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr, b);
            ptr++;
        }
    }

    return 0;
}